

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_unit.c
# Opt level: O3

zt_unit_test * zt_unit_register_test(zt_unit_suite *suite,char *name,zt_unit_test_fn test_fn)

{
  zt_elist *pzVar1;
  zt_unit_test *pzVar2;
  size_t __n;
  char *__dest;
  
  pzVar2 = (zt_unit_test *)zt_calloc_p(1,0x108);
  __n = strlen(name);
  __dest = (char *)zt_calloc_p(__n + 1,1);
  pzVar2->name = __dest;
  strncpy(__dest,name,__n);
  pzVar2->success = -1;
  pzVar2->test_fn = test_fn;
  pzVar2->assertions = 0;
  pzVar1 = (suite->tests).prev;
  (suite->tests).prev = (zt_elist *)pzVar2;
  (pzVar2->test).next = &suite->tests;
  (pzVar2->test).prev = pzVar1;
  pzVar1->next = (zt_elist *)pzVar2;
  return pzVar2;
}

Assistant:

struct zt_unit_test *
zt_unit_register_test(struct zt_unit_suite    * suite,
                      const char * name,
                      zt_unit_test_fn test_fn)
{
    struct zt_unit_test * test = zt_calloc(struct zt_unit_test, 1);
    size_t                len;

    zt_assert(suite);
    zt_assert(name);

    len = strlen(name);

    test->name = zt_calloc(char, len + 1);
    strncpy(test->name, name, len);
    test->success = -1;
    test->test_fn = test_fn;
    test->assertions = 0;

    zt_elist_add_tail(&suite->tests, &test->test);
    return test;
}